

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segdmp.c
# Opt level: O0

int segdmp_open_read(char **dirs,char *dfn,char *ifn,uint32 *out_n_id,segdmp_type_t *out_data_type,
                    uint32 i_n_stream,uint32 *i_vecsize,uint32 i_blksize)

{
  FILE *pFVar1;
  uint32 *n_frame;
  uint local_1040;
  uint32 swp;
  uint32 i;
  uint32 n_dir;
  char fn [4097];
  uint32 i_n_stream_local;
  segdmp_type_t *out_data_type_local;
  uint32 *out_n_id_local;
  char *ifn_local;
  char *dfn_local;
  char **dirs_local;
  
  vecsize = i_vecsize;
  blksize = i_blksize;
  n_seg = (uint32 *)0x0;
  for (local_1040 = 0; dirs[local_1040] != (char *)0x0; local_1040 = local_1040 + 1) {
  }
  swp = local_1040;
  n_stream = i_n_stream;
  fn._4092_4_ = i_n_stream;
  unique0x10000251 = out_data_type;
  idx_fp = (FILE **)__ckd_calloc__((ulong)local_1040,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                   ,0x189);
  dmp_fp = (FILE **)__ckd_calloc__((ulong)swp,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                   ,0x18a);
  dmp_swp = (uint32 *)
            __ckd_calloc__((ulong)swp,4,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                           ,0x18b);
  local_1040 = 0;
  while( true ) {
    if (swp <= local_1040) {
      n_part = swp;
      *stack0xffffffffffffffd0 = cur_type;
      *out_n_id = n_id;
      id_nxt_off = (uint32 *)
                   __ckd_calloc__((ulong)n_id,4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                  ,0x1a5);
      for (local_1040 = 0; local_1040 < n_id; local_1040 = local_1040 + 1) {
        id_nxt_off[local_1040] = id_off[local_1040];
      }
      nxt_seg = (uint32 *)
                __ckd_calloc__((ulong)n_id,4,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                               ,0x1a9);
      return 0;
    }
    sprintf((char *)&i,"%s/%s",dirs[local_1040],ifn);
    pFVar1 = s3open((char *)&i,"rb",dmp_swp + local_1040);
    idx_fp[local_1040] = pFVar1;
    if (idx_fp[local_1040] == (FILE *)0x0) {
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                     ,0x191,"Unable to open index");
      exit(1);
    }
    read_idx(local_1040);
    sprintf((char *)&i,"%s/%s",dirs[local_1040],dfn);
    pFVar1 = s3open((char *)&i,"rb",(uint32 *)((long)&n_frame + 4));
    dmp_fp[local_1040] = pFVar1;
    if (dmp_fp[local_1040] == (FILE *)0x0) {
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                     ,0x199,"Unable to open dmp");
      exit(1);
    }
    if (n_frame._4_4_ != dmp_swp[local_1040]) break;
    local_1040 = local_1040 + 1;
  }
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
          ,0x19c,"Dmp and index assumed to have same byte-order, but they don\'t\n");
  exit(1);
}

Assistant:

int
segdmp_open_read(const char **dirs,		/* directories available for dump files */
		 const char *dfn,		/* dump file name */
		 const char *ifn,		/* index file name */
		 uint32 *out_n_id,		/* # of segment id's (i.e. phones, states, etc.)*/
		 segdmp_type_t *out_data_type, /* type of data to store in segment dump */
		 uint32 i_n_stream,
		 uint32* i_vecsize,
		 uint32 i_blksize)	
{
    char fn[MAXPATHLEN+1];
    uint32 n_dir;
    uint32 i, swp;
    uint32 *n_frame;
    
    n_stream = i_n_stream;
    vecsize = i_vecsize;
    blksize = i_blksize;
    
    n_seg = NULL;
    n_frame = NULL;

    for (i = 0; dirs[i]; i++);
    n_dir = i;

    idx_fp = ckd_calloc(n_dir, sizeof(FILE *));
    dmp_fp = ckd_calloc(n_dir, sizeof(FILE *));
    dmp_swp = ckd_calloc(n_dir, sizeof(uint32));

    for (i = 0; i < n_dir; i++) {
	sprintf(fn, "%s/%s", dirs[i], ifn);
	idx_fp[i] = s3open(fn, "rb", &dmp_swp[i]);
	if (idx_fp[i] == NULL) {
	    E_FATAL_SYSTEM("Unable to open index");
	}

	read_idx(i);

	sprintf(fn, "%s/%s", dirs[i], dfn);
	dmp_fp[i] = s3open(fn, "rb", &swp);
	if (dmp_fp[i] == NULL) {
	    E_FATAL_SYSTEM("Unable to open dmp");
	}
	if (swp != dmp_swp[i]) {
	    E_FATAL("Dmp and index assumed to have same byte-order, but they don't\n");
	}
    }

    n_part = n_dir;

    *out_data_type = cur_type;
    *out_n_id = n_id;

    id_nxt_off = ckd_calloc(n_id, sizeof(uint32));
    for (i = 0; i < n_id; i++) {
	id_nxt_off[i] = id_off[i];
    }
    nxt_seg    = ckd_calloc(n_id, sizeof(uint32));

    return S3_SUCCESS;
}